

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecmanager.cxx
# Opt level: O0

string * __thiscall
vigra::CodecManager::getFileTypeByMagicString(CodecManager *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  pointer ppVar4;
  string *in_RDX;
  char *in_RSI;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RDI;
  vector<char,_std::allocator<char>_> *magic;
  const_iterator iter;
  string msg;
  ifstream stream;
  char fmagic [4];
  uint magiclen;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  allocator *in_stack_fffffffffffffd50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __first1;
  undefined4 in_stack_fffffffffffffd74;
  undefined1 predicate;
  __normal_iterator<const_std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_268;
  allocator local_259;
  string local_258 [48];
  char local_228 [520];
  undefined1 local_20 [4];
  undefined4 local_1c;
  string *local_18;
  
  predicate = (undefined1)((uint)in_stack_fffffffffffffd74 >> 0x18);
  local_1c = 4;
  __first1._M_current = in_RDI._M_current;
  local_18 = in_RDX;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar3,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    in_stack_fffffffffffffd50 = &local_259;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"Unable to open file \'",in_stack_fffffffffffffd50);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::__cxx11::string::operator+=(local_258,local_18);
    std::__cxx11::string::operator+=(local_258,"\'.");
    std::__cxx11::string::c_str();
    throw_precondition_error
              ((bool)predicate,in_RSI,__first1._M_current,(int)((ulong)in_RDI._M_current >> 0x20));
    std::__cxx11::string::~string(local_258);
  }
  std::istream::read(local_228,(long)local_20);
  std::ifstream::close();
  local_268._M_current =
       (pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  do {
    std::
    vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::end((vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    bVar2 = __gnu_cxx::operator<
                      ((__normal_iterator<const_std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffd50,
                       (__normal_iterator<const_std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    if (!bVar2) {
      std::__cxx11::string::string((string *)in_RDI._M_current);
LAB_00156ca7:
      std::ifstream::~ifstream(local_228);
      return (string *)__first1._M_current;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator->(&local_268);
    std::vector<char,_std::allocator<char>_>::begin
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::vector<char,_std::allocator<char>_>::end
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd4f =
         std::
         equal<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char*>
                   (__first1,in_RDI,(char *)in_stack_fffffffffffffd50);
    if ((bool)in_stack_fffffffffffffd4f) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_268);
      std::__cxx11::string::string((string *)in_RDI._M_current,(string *)&ppVar4->second);
      goto LAB_00156ca7;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_268);
  } while( true );
}

Assistant:

std::string
    CodecManager::getFileTypeByMagicString( const std::string & filename )
        const
    {
        // support for reading the magic string from stdin has been dropped
        // it was not guaranteed to work by the Standard

        // get the magic string
        const unsigned int magiclen = 4;
        char fmagic[magiclen];
#ifdef VIGRA_NEED_BIN_STREAMS
        std::ifstream stream(filename.c_str(), std::ios::binary);
#else
        std::ifstream stream(filename.c_str());
#endif
        if(!stream.good())
        {
            std::string msg("Unable to open file '");
            msg += filename;
            msg += "'.";
            vigra_precondition(0, msg.c_str());
        }
        stream.read( fmagic, magiclen );
        stream.close();

        // compare with the known magic strings
        typedef std::vector< std::pair< std::vector<char>, std::string > >
            magic_type;
        for( magic_type::const_iterator iter = magicStrings.begin();
             iter < magicStrings.end(); ++iter ) {
            const std::vector<char> & magic = iter->first;
            if ( std::equal( magic.begin(), magic.end(), fmagic ) )
                return iter->second;
        }

        // did not find a matching string
        return std::string();
    }